

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O2

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  char cVar1;
  SQChar SVar2;
  int iVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  long lVar7;
  longlong lVar8;
  size_t sVar9;
  SQChar *pSVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  SQInteger ti;
  size_t local_a0;
  long local_98;
  SQFloat tf;
  long local_88;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  long local_50;
  long local_48;
  SQInteger *local_40;
  SQChar **local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,&format);
  if (SVar4 < 0) {
    return SVar4;
  }
  local_40 = outlen;
  local_38 = output;
  SVar5 = sq_getsize(v,nformatstringidx);
  local_a0 = SVar5 + 2;
  pSVar6 = sq_getscratchpad(v,local_a0);
  local_98 = 0;
  lVar11 = 0;
  lVar14 = 0;
  local_48 = SVar5;
LAB_001253fd:
  local_88 = nformatstringidx + 1;
  do {
    if (local_48 <= lVar11) {
      *local_40 = lVar14;
      pSVar6[lVar14] = '\0';
      *local_38 = pSVar6;
      return 0;
    }
    if (format[lVar11] == '%') {
      if (format[lVar11 + 1] != '%') break;
      pSVar6[lVar14] = '%';
      lVar11 = lVar11 + 2;
    }
    else {
      pSVar6[lVar14] = format[lVar11];
      lVar11 = lVar11 + 1;
    }
    lVar14 = lVar14 + 1;
  } while( true );
  SVar5 = sq_gettop(v);
  pSVar6 = format;
  if (SVar5 <= nformatstringidx) {
    pcVar13 = "not enough parameters for the given format string";
    goto LAB_001257ad;
  }
  lVar12 = lVar11 + 1;
  fmt[0] = '%';
  pcVar13 = format + lVar11 + 2;
  lVar11 = lVar11 + 2;
  lVar15 = lVar12;
  while (((ulong)(byte)format[lVar15] < 0x31 &&
         ((0x1280900000000U >> ((ulong)(byte)format[lVar15] & 0x3f) & 1) != 0))) {
    lVar15 = lVar15 + 1;
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 1;
  }
  lVar7 = 0;
  do {
    if (9 < (int)format[lVar15] - 0x30U) {
      *(undefined1 *)((long)&ti + lVar7) = 0;
      if (lVar7 == 0) {
        local_98 = 0;
      }
      else {
        local_50 = lVar12;
        local_98 = strtoll((char *)&ti,&ts,10);
        lVar12 = local_50;
      }
      nformatstringidx = local_88;
      if (pSVar6[lVar15] != '.') goto LAB_00125573;
      lVar7 = 0;
      goto LAB_0012550e;
    }
    *(SQChar *)((long)&ti + lVar7) = format[lVar15];
    lVar15 = lVar15 + 1;
    lVar7 = lVar7 + 1;
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 1;
  } while (lVar7 != 3);
  pcVar13 = "width format too long";
LAB_0012558e:
  lVar15 = sq_throwerror(v,pcVar13);
  nformatstringidx = local_88;
LAB_001255b7:
  if (lVar15 < 0) {
    return -1;
  }
  ts = (SQChar *)0x0;
  ti = 0;
  tf = 0.0;
  cVar1 = format[lVar15];
  switch(cVar1) {
  case 'd':
  case 'i':
  case 'o':
  case 'u':
  case 'x':
switchD_001255f4_caseD_64:
    sVar9 = strlen(fmt);
    SVar2 = fmt[sVar9 - 1];
    (fmt + (sVar9 - 1))[0] = 'l';
    (fmt + (sVar9 - 1))[1] = 'l';
    fmt[sVar9 + 1] = SVar2;
    fmt[sVar9 + 2] = '\0';
  case 'c':
    SVar4 = sq_getinteger(v,nformatstringidx,&ti);
    if (SVar4 < 0) {
      pcVar13 = "integer expected for the specified format";
      goto LAB_001257ad;
    }
    sVar9 = local_a0 + local_98 + 0x66;
    pSVar6 = sq_getscratchpad(v,sVar9);
    pSVar10 = (SQChar *)ti;
    local_a0 = sVar9;
    break;
  case 'e':
  case 'f':
  case 'g':
    goto switchD_001255f4_caseD_65;
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
switchD_001255f4_caseD_68:
    pcVar13 = "invalid format";
    goto LAB_001257ad;
  case 's':
    SVar4 = sq_getstring(v,nformatstringidx,&ts);
    if (SVar4 < 0) {
      pcVar13 = "string expected for the specified format";
      goto LAB_001257ad;
    }
    SVar5 = sq_getsize(v,nformatstringidx);
    local_a0 = local_a0 + local_98 + SVar5 + 2;
    pSVar6 = sq_getscratchpad(v,local_a0);
    pSVar10 = ts;
    break;
  default:
    if ((cVar1 != 'E') && (cVar1 != 'G')) {
      if (cVar1 != 'X') goto switchD_001255f4_caseD_68;
      goto switchD_001255f4_caseD_64;
    }
    goto switchD_001255f4_caseD_65;
  }
  iVar3 = snprintf(pSVar6 + lVar14,local_a0,fmt,pSVar10);
LAB_001256e7:
  lVar14 = iVar3 + lVar14;
  lVar11 = lVar15 + 1;
  goto LAB_001253fd;
LAB_0012550e:
  if ((int)*pcVar13 - 0x30U < 10) goto code_r0x0012551b;
  *(undefined1 *)((long)&ti + lVar7) = 0;
  lVar15 = lVar11;
  if (lVar7 != 0) {
    lVar8 = strtoll((char *)&ti,&ts,10);
    local_98 = local_98 + lVar8;
  }
LAB_00125573:
  lVar11 = lVar15 - lVar12;
  if (0x14 < lVar11) {
    pcVar13 = "format too long";
    goto LAB_0012558e;
  }
  memcpy(fmt + 1,pSVar6 + lVar12,lVar11 + 1);
  fmt[lVar11 + 2] = '\0';
  nformatstringidx = local_88;
  goto LAB_001255b7;
code_r0x0012551b:
  *(char *)((long)&ti + lVar7) = *pcVar13;
  lVar7 = lVar7 + 1;
  lVar11 = lVar11 + 1;
  pcVar13 = pcVar13 + 1;
  if (lVar7 == 3) goto code_r0x0012552e;
  goto LAB_0012550e;
code_r0x0012552e:
  lVar15 = sq_throwerror(v,"precision format too long");
  goto LAB_001255b7;
switchD_001255f4_caseD_65:
  SVar4 = sq_getfloat(v,nformatstringidx,&tf);
  if (SVar4 < 0) {
    pcVar13 = "float expected for the specified format";
LAB_001257ad:
    SVar4 = sq_throwerror(v,pcVar13);
    return SVar4;
  }
  sVar9 = local_a0 + local_98 + 0x66;
  pSVar6 = sq_getscratchpad(v,sVar9);
  local_a0 = sVar9;
  iVar3 = snprintf(pSVar6 + lVar14,sVar9,fmt,(double)tf);
  goto LAB_001256e7;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}